

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int ARKodeGetNumLinIters(void *arkode_mem,long *nliters)

{
  long lVar1;
  int line;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x568;
LAB_001459fe:
    arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeGetNumLinIters",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,msgfmt);
  }
  else {
    if (*(int *)((long)arkode_mem + 0x128) == 0) {
      *nliters = 0;
    }
    else {
      lVar1 = (**(code **)((long)arkode_mem + 0x140))(arkode_mem);
      if (lVar1 == 0) {
        msgfmt = "Linear solver memory is NULL.";
        iVar2 = -2;
        error_code = -2;
        line = 0xff8;
        goto LAB_001459fe;
      }
      *nliters = *(long *)(lVar1 + 0xa0);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ARKodeGetNumLinIters(void* arkode_mem, long int* nliters)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Return 0 for incompatible steppers */
  if (!ark_mem->step_supports_implicit)
  {
    *nliters = 0;
    return (ARK_SUCCESS);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set output and return */
  *nliters = arkls_mem->nli;
  return (ARKLS_SUCCESS);
}